

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conductor.hpp
# Opt level: O0

Color __thiscall
ConductorBRDF::sample_f
          (ConductorBRDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,Sampler *sampler)

{
  undefined8 *in_RCX;
  float *in_RDX;
  undefined4 *in_R8;
  undefined8 extraout_XMM0_Qb;
  vec3f vVar1;
  Color CVar2;
  Color r2;
  Color t2;
  Color r1;
  Color t1;
  float cos;
  vec3f *in_stack_fffffffffffffb30;
  vec3f *this_00;
  undefined1 in_stack_fffffffffffffb38 [16];
  undefined1 auVar3 [16];
  undefined8 local_3b0;
  float local_3a8;
  undefined8 local_3a0;
  float local_398;
  vec3f local_38c;
  vec3f local_380;
  vec3f local_370;
  vec3f local_360;
  undefined8 local_350;
  float local_348;
  undefined8 local_340;
  float local_338;
  undefined8 local_330;
  float local_328;
  undefined8 local_320;
  float local_318;
  undefined8 local_310;
  float local_308;
  vec3f local_2fc;
  vec3f local_2f0;
  vec3f local_2e0;
  vec3f local_2d0;
  undefined8 local_2c0;
  float local_2b8;
  undefined8 local_2b0;
  float local_2a8;
  undefined8 local_2a0;
  float local_298;
  undefined8 local_290;
  float local_288;
  undefined8 local_280;
  float local_278;
  undefined8 local_270;
  float local_268;
  vec3f local_260;
  undefined8 local_250;
  float local_248;
  vec3f local_240;
  undefined8 local_230;
  float local_228;
  undefined8 local_220;
  float local_218;
  vec3f local_210;
  vec3f local_200;
  vec3f local_1ec;
  undefined8 local_1e0;
  float local_1d8;
  vec3f local_1d0;
  vec3f local_1c0;
  undefined8 local_1b0;
  float local_1a8;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  float local_168;
  vec3f local_15c;
  vec3f local_150;
  vec3f local_140;
  vec3f local_130;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  vec3f local_d0;
  vec3f local_c0;
  vec3f local_b0;
  undefined8 local_a0;
  float local_98;
  vec3f local_90;
  undefined8 local_80;
  float local_78;
  undefined8 local_70;
  float local_68;
  undefined8 local_60;
  float local_58;
  float local_50;
  vec3f local_4c;
  undefined4 *local_38;
  undefined8 *local_30;
  float *local_28;
  float fVar4;
  
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  vec3f::vec3f(&local_4c,-*in_RDX,-in_RDX[1],in_RDX[2]);
  *(float *)(local_30 + 1) = local_4c.z;
  *local_30 = local_4c._0_8_;
  local_50 = ABS(local_28[2]);
  *local_38 = 0x3f800000;
  vVar1 = ::operator*(in_stack_fffffffffffffb38._8_8_,in_stack_fffffffffffffb38._0_8_);
  local_90.z = vVar1.z;
  local_78 = local_90.z;
  local_90._0_8_ = vVar1._0_8_;
  local_80._0_4_ = local_90.x;
  local_80._4_4_ = local_90.y;
  local_90 = vVar1;
  vVar1 = ::operator*(in_stack_fffffffffffffb38._8_8_,in_stack_fffffffffffffb38._0_8_);
  local_b0.z = vVar1.z;
  local_98 = local_b0.z;
  local_b0._0_8_ = vVar1._0_8_;
  local_a0._0_4_ = local_b0.x;
  local_a0._4_4_ = local_b0.y;
  local_b0 = vVar1;
  vVar1 = ::operator+(in_stack_fffffffffffffb38._8_8_,in_stack_fffffffffffffb38._0_8_);
  local_c0.z = vVar1.z;
  local_68 = local_c0.z;
  local_c0._0_8_ = vVar1._0_8_;
  local_70._0_4_ = local_c0.x;
  local_70._4_4_ = local_c0.y;
  local_c0 = vVar1;
  vVar1 = ::operator*(in_stack_fffffffffffffb38._8_8_,in_stack_fffffffffffffb38._4_4_);
  local_d0.z = vVar1.z;
  local_58 = local_d0.z;
  local_d0._0_8_ = vVar1._0_8_;
  local_60._0_4_ = local_d0.x;
  local_60._4_4_ = local_d0.y;
  local_d0 = vVar1;
  vVar1 = ::operator*(in_stack_fffffffffffffb38._0_4_,in_stack_fffffffffffffb30);
  local_130.z = vVar1.z;
  local_118 = local_130.z;
  local_130._0_8_ = vVar1._0_8_;
  local_120._0_4_ = local_130.x;
  local_120._4_4_ = local_130.y;
  local_130 = vVar1;
  vVar1 = ::operator*(in_stack_fffffffffffffb38._8_8_,in_stack_fffffffffffffb38._4_4_);
  local_140.z = vVar1.z;
  local_108 = local_140.z;
  local_140._0_8_ = vVar1._0_8_;
  local_110._0_4_ = local_140.x;
  local_110._4_4_ = local_140.y;
  local_140 = vVar1;
  vVar1 = ::operator-(in_stack_fffffffffffffb38._8_8_,in_stack_fffffffffffffb38._0_8_);
  local_150.z = vVar1.z;
  local_f8 = local_150.z;
  local_150._0_8_ = vVar1._0_8_;
  local_100._0_4_ = local_150.x;
  local_100._4_4_ = local_150.y;
  this_00 = &local_15c;
  local_150 = vVar1;
  vec3f::vec3f(this_00,1.0);
  vVar1 = ::operator+(in_stack_fffffffffffffb38._8_8_,in_stack_fffffffffffffb38._0_8_);
  local_168 = vVar1.z;
  local_170 = vVar1._0_8_;
  auVar3._8_4_ = (int)extraout_XMM0_Qb;
  auVar3._0_8_ = local_170;
  auVar3._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  local_f0 = local_170;
  local_e8 = local_168;
  vVar1 = ::operator*(vVar1.x,this_00);
  local_1c0.z = vVar1.z;
  local_1a8 = local_1c0.z;
  local_1c0._0_8_ = vVar1._0_8_;
  local_1b0._0_4_ = local_1c0.x;
  local_1b0._4_4_ = local_1c0.y;
  local_1c0 = vVar1;
  vVar1 = ::operator*(auVar3._8_8_,auVar3._4_4_);
  local_1d0.z = vVar1.z;
  local_198 = local_1d0.z;
  local_1d0._0_8_ = vVar1._0_8_;
  local_1a0._0_4_ = local_1d0.x;
  local_1a0._4_4_ = local_1d0.y;
  local_1d0 = vVar1;
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_1d8 = vVar1.z;
  local_1e0 = vVar1._0_8_;
  local_190 = local_1e0;
  local_188 = local_1d8;
  vec3f::vec3f(&local_1ec,1.0);
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_200.z = vVar1.z;
  local_178 = local_200.z;
  local_200._0_8_ = vVar1._0_8_;
  local_180._0_4_ = local_200.x;
  local_180._4_4_ = local_200.y;
  local_200 = vVar1;
  vVar1 = operator/(auVar3._8_8_,auVar3._0_8_);
  local_210.z = vVar1.z;
  local_d8 = local_210.z;
  local_210._0_8_ = vVar1._0_8_;
  local_e0._0_4_ = local_210.x;
  local_e0._4_4_ = local_210.y;
  local_210 = vVar1;
  vVar1 = ::operator*(auVar3._8_8_,auVar3._0_8_);
  local_240.z = vVar1.z;
  local_228 = local_240.z;
  local_240._0_8_ = vVar1._0_8_;
  local_230._0_4_ = local_240.x;
  local_230._4_4_ = local_240.y;
  local_240 = vVar1;
  vVar1 = ::operator*(auVar3._8_8_,auVar3._0_8_);
  local_260.z = vVar1.z;
  local_248 = local_260.z;
  local_260._0_8_ = vVar1._0_8_;
  local_250._0_4_ = local_260.x;
  local_250._4_4_ = local_260.y;
  local_260 = vVar1;
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_268 = vVar1.z;
  local_270 = vVar1._0_8_;
  local_220 = local_270;
  local_218 = local_268;
  vVar1 = ::operator*(auVar3._0_4_,this_00);
  local_2d0.z = vVar1.z;
  local_2b8 = local_2d0.z;
  local_2d0._0_8_ = vVar1._0_8_;
  local_2c0._0_4_ = local_2d0.x;
  local_2c0._4_4_ = local_2d0.y;
  local_2d0 = vVar1;
  vVar1 = ::operator*(auVar3._8_8_,auVar3._4_4_);
  local_2e0.z = vVar1.z;
  local_2a8 = local_2e0.z;
  local_2e0._0_8_ = vVar1._0_8_;
  local_2b0._0_4_ = local_2e0.x;
  local_2b0._4_4_ = local_2e0.y;
  local_2e0 = vVar1;
  vVar1 = ::operator-(auVar3._8_8_,auVar3._0_8_);
  local_2f0.z = vVar1.z;
  local_298 = local_2f0.z;
  local_2f0._0_8_ = vVar1._0_8_;
  local_2a0._0_4_ = local_2f0.x;
  local_2a0._4_4_ = local_2f0.y;
  local_2f0 = vVar1;
  vec3f::vec3f(&local_2fc,local_50 * local_50);
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_308 = vVar1.z;
  local_310 = vVar1._0_8_;
  local_290 = local_310;
  local_288 = local_308;
  vVar1 = ::operator*(auVar3._0_4_,this_00);
  local_360.z = vVar1.z;
  local_348 = local_360.z;
  local_360._0_8_ = vVar1._0_8_;
  local_350._0_4_ = local_360.x;
  local_350._4_4_ = local_360.y;
  local_360 = vVar1;
  vVar1 = ::operator*(auVar3._8_8_,auVar3._4_4_);
  local_370.z = vVar1.z;
  local_338 = local_370.z;
  local_370._0_8_ = vVar1._0_8_;
  local_340._0_4_ = local_370.x;
  local_340._4_4_ = local_370.y;
  local_370 = vVar1;
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_380.z = vVar1.z;
  local_328 = local_380.z;
  local_380._0_8_ = vVar1._0_8_;
  local_330._0_4_ = local_380.x;
  local_330._4_4_ = local_380.y;
  local_380 = vVar1;
  vec3f::vec3f(&local_38c,local_50 * local_50);
  vVar1 = ::operator+(auVar3._8_8_,auVar3._0_8_);
  local_398 = vVar1.z;
  local_318 = local_398;
  local_3a0 = vVar1._0_8_;
  local_320 = local_3a0;
  vVar1 = operator/(auVar3._8_8_,auVar3._0_8_);
  local_3a8 = vVar1.z;
  local_278 = local_3a8;
  local_3b0 = vVar1._0_8_;
  local_280 = local_3b0;
  ::operator+(auVar3._8_8_,auVar3._0_8_);
  ::operator*(auVar3._0_4_,this_00);
  vVar1 = ::operator*(auVar3._8_8_,auVar3._0_8_);
  CVar2.x = vVar1.x;
  CVar2.y = vVar1.y;
  register0x00001240 = vVar1.z;
  return CVar2;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		wi = vec3f(-wo.x, -wo.y, wo.z);
		float cos = fabs(wo.z);
		pdf = 1;
		Color t1 = (eta*eta + k*k) * (cos*cos);
		Color r1 = (t1 - 2*eta*cos + 1) / (t1 + 2*eta*cos + 1);
		Color t2 = eta*eta + k*k;
		Color r2 = (t2 - 2*eta*cos + Color(cos*cos)) / (t2 + 2*eta*cos + Color(cos*cos));
		return 0.5 / cos * (r1 + r2) * albedo;
	}